

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_by_class_dim(Omega_h *this,Mesh *mesh,Int ent_dim,Int class_dim)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<signed_char> e2class_dim;
  allocator local_61;
  Write<signed_char> local_60;
  undefined1 local_50 [48];
  
  std::__cxx11::string::string((string *)(local_50 + 0x10),"class_dim",&local_61);
  Mesh::get_array<signed_char>((Mesh *)local_50,(Int)mesh,(string *)(ulong)(uint)ent_dim);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  Write<signed_char>::Write(&local_60,(Write<signed_char> *)local_50);
  each_eq_to<signed_char>(this,(Read<signed_char> *)&local_60,(char)class_dim);
  Write<signed_char>::~Write(&local_60);
  Write<signed_char>::~Write((Write<signed_char> *)local_50);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_by_class_dim(Mesh* mesh, Int ent_dim, Int class_dim) {
  auto e2class_dim = mesh->get_array<I8>(ent_dim, "class_dim");
  return each_eq_to(e2class_dim, static_cast<I8>(class_dim));
}